

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::skip_spaces_and_empty_lines
          (parser_t<comments_skipper_t> *this)

{
  bool bVar1;
  char cVar2;
  parser_t<comments_skipper_t> *this_local;
  
  while( true ) {
    while( true ) {
      bVar1 = input_stream_t::eof(&this->input);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return;
      }
      skip_spaces(this);
      cVar2 = input_stream_t::peek(&this->input);
      if (cVar2 != '#') break;
      parse_comment(this);
      parse_new_line(this);
    }
    cVar2 = input_stream_t::peek(&this->input);
    if ((cVar2 != '\r') && (cVar2 = input_stream_t::peek(&this->input), cVar2 != '\n')) break;
    parse_new_line(this);
  }
  return;
}

Assistant:

void skip_spaces_and_empty_lines() {
        while (!input.eof()) {
            skip_spaces();

            if (input.peek() == '#') {
                parse_comment();
                parse_new_line();
            } else if (input.peek() == '\r' || input.peek() == '\n') {
                parse_new_line();
            } else {
                break;
            }
        }
    }